

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O3

int epoll_update(int op,filter *filt,knote *kn,int ev,_Bool delete)

{
  fd_state *pfVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  char cVar5;
  undefined3 in_register_00000081;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  fd_state *fds;
  fd_state *local_58;
  undefined4 local_50;
  int local_4c;
  filter *local_48;
  uint local_3c;
  epoll_udata *local_38;
  
  uVar6 = CONCAT31(in_register_00000081,delete);
  local_58 = (fd_state *)0x0;
  local_4c = (int)(kn->kev).ident;
  local_48 = filt;
  uVar2 = epoll_fd_state(&local_58,kn,false);
  local_50 = uVar6;
  if (op == 3) {
    uVar9 = ev;
    if (delete) {
      uVar7 = epoll_fd_state(&local_58,kn,true);
      if ((~ev & uVar7) != 0) {
        epoll_fd_state_del(&local_58,kn,~ev & uVar7);
      }
    }
  }
  else if (op == 2) {
    uVar9 = ~ev & uVar2;
    if (delete) {
      uVar7 = epoll_fd_state(&local_58,kn,true);
      uVar7 = ev & uVar7 & 5;
      if (uVar7 != 0) {
        epoll_fd_state_del(&local_58,kn,uVar7);
      }
    }
  }
  else {
    if (op != 1) {
      return -1;
    }
    uVar9 = ev | uVar2;
  }
  uVar7 = uVar9 & 5;
  if (uVar7 == 0 || uVar2 != 0) {
    iVar8 = 2;
    if ((uVar2 == 0 || uVar7 != 0) && (iVar8 = 3, uVar2 == uVar7)) {
      return 0;
    }
  }
  else {
    epoll_fd_state_mod(&local_58,kn,uVar7);
    iVar8 = 1;
  }
  pfVar1 = local_58;
  local_38 = &local_58->fds_udata;
  local_3c = uVar9;
  iVar3 = epoll_ctl(local_48->kf_kqueue->epollfd,iVar8,local_4c,(epoll_event *)&local_3c);
  if (iVar3 < 0) {
    iVar8 = -1;
    if (uVar7 == 0 || uVar2 != 0) {
      piVar4 = __errno_location();
      if (*piVar4 != 9) {
        return -1;
      }
      if (pfVar1->fds_read == kn) {
        uVar2 = 1;
      }
      else {
        uVar2 = (uint)(pfVar1->fds_write == kn) << 2;
      }
      iVar8 = 0;
      uVar7 = ~uVar7 & uVar2;
      if (uVar7 == 0) {
        return -1;
      }
    }
  }
  else {
    cVar5 = (char)local_50;
    if (iVar8 == 3) {
      uVar9 = ~uVar7;
      if ((~uVar2 & uVar7) != 0) {
        epoll_fd_state_mod(&local_58,kn,~uVar2 & uVar7);
      }
      iVar8 = 0;
      uVar7 = uVar9 & uVar2;
      if (cVar5 != '\x01' || (uVar9 & uVar2) == 0) {
        return 0;
      }
    }
    else {
      if (iVar8 != 2) {
        return 0;
      }
      if (cVar5 == '\0') {
        return 0;
      }
      iVar8 = 0;
      uVar7 = uVar2 & ~uVar7;
    }
  }
  epoll_fd_state_del(&local_58,kn,uVar7);
  return iVar8;
}

Assistant:

int
epoll_update(int op, struct filter *filt, struct knote *kn, int ev, bool delete)
{
    struct fd_state *fds = NULL;
    int have_ev, want, want_ev;
    int opn;
    int fd;

    fd = kn->kev.ident;

#define EV_EPOLLINOUT(_x) ((_x) & (EPOLLIN | EPOLLOUT))

    if (KNOTE_DISABLED(kn)) dbg_printf("fd=%i kn=%p is disabled", fd, kn);
    if (KNOTE_IS_EOF(kn)) dbg_printf("fd=%i kn=%p is EOF", fd, kn);

    /*
     * Determine the current state of the file descriptor
     * and see if we need to make changes.
     */
    have_ev = epoll_fd_state(&fds, kn, false);            /* ...enabled only */

    dbg_printf("fd=%i have_ev=0x%04x (%s)", fd, have_ev, epoll_flags_dump(have_ev));
    switch (op) {
    case EPOLL_CTL_ADD:
        want = have_ev | ev;            /* This also preserves other option flags */
        break;

    case EPOLL_CTL_DEL:
        want = have_ev & ~ev;           /* No options for delete */

        /*
         * If we're performing a delete we need
         * to check for previously disabled
         * knotes that may now be being deleted.
         */
        if (delete) {
            int to_delete;

            to_delete = epoll_fd_state(&fds, kn, true); /* ...disabled only */
            dbg_printf("fd=%i disabled_ev=0x%04x (%s)", fd, to_delete, epoll_flags_dump(to_delete));
            to_delete &= EV_EPOLLINOUT(ev);

            if (to_delete) {
                dbg_printf("fd=%i ev=%i removing disabled fd state", fd, op);
                epoll_fd_state_del(&fds, kn, to_delete);
            }
        }
        break;

    case EPOLL_CTL_MOD:
        want = ev;                   /* We assume the caller knows what its doing... */

        if (delete) {
            int to_delete;

            to_delete = epoll_fd_state(&fds, kn, true); /* ...disabled only */
            dbg_printf("fd=%i disabled_ev=0x%04x (%s)", fd, to_delete, epoll_flags_dump(to_delete));
            to_delete &= ~ev;

            if (to_delete) {
                dbg_printf("fd=%i ev=%i removing disabled fd state", fd, op);
                epoll_fd_state_del(&fds, kn, to_delete);
            }
        }
        break;

    default:
        assert(0);
        return (-1);
    }

    /*
     * We only want the read/write flags for comparisons.
     */
    want_ev = EV_EPOLLINOUT(want);
     if (!have_ev && want_ev) {        /* There's no events registered and we want some */
        opn = EPOLL_CTL_ADD;
        epoll_fd_state_mod(&fds, kn, want_ev & ~have_ev);
    }
    else if (have_ev && !want_ev)       /* We have events registered but don't want any */
        opn = EPOLL_CTL_DEL;
    else if (have_ev != want_ev)        /* There's events but they're not what we want */
        opn = EPOLL_CTL_MOD;
    else
        return (0);

    dbg_printf("fd=%i op=0x%04x (%s) opn=0x%04x (%s) %s",
               fd,
               op, epoll_op_dump(op),
               opn, epoll_op_dump(opn),
               epoll_event_dump(EPOLL_EV_FDS(want, fds)));

    if (epoll_ctl(filter_epoll_fd(filt), opn, fd, EPOLL_EV_FDS(want, fds)) < 0) {
        dbg_printf("epoll_ctl(2): %s", strerror(errno));

        switch (opn) {
        case EPOLL_CTL_ADD:
            epoll_fd_state_del(&fds, kn, want_ev & ~have_ev);
            break;

        case EPOLL_CTL_DEL:
        case EPOLL_CTL_MOD:
            /*
             * File descriptor went away and we weren't notified
             * not necessarily an error.
             */
            if (errno == EBADF) {
                int kn_ev = 0;

                if (kn == fds->fds_read) {
                    kn_ev = EPOLLIN;
                } else if (kn == fds->fds_write) {
                    kn_ev = EPOLLOUT;
                }
                kn_ev &= ~want_ev;    /* If it wasn't wanted... */

                if (kn_ev) {
                    dbg_printf("clearing fd=%i fds=%p ev=%s", fd, fds, epoll_flags_dump(kn_ev));
                    epoll_fd_state_del(&fds, kn, kn_ev);
                    return (0);
                }
            }
            break;
        }

        return (-1);
    }

    /*
     * Only change fd state for del and mod on success
     * we need to 'add' before so that we get the fd_state
     * structure to pass in to epoll.
     */
    switch (opn) {
    case EPOLL_CTL_DEL:
        if (delete) {
            dbg_printf("fd=%i ev=%i removing fd state", fd, op);
            epoll_fd_state_del(&fds, kn, have_ev & ~want_ev);      /* We rely on the caller to mark the knote as disabled */
        }
        break;

    case EPOLL_CTL_MOD:
    {
        int add, del;

        add = want_ev & ~have_ev;
        del = have_ev & ~want_ev;

        if (add) epoll_fd_state_mod(&fds, kn, add);
        if (del && delete) {
            dbg_printf("fd=%i ev=%i removing fd state", fd, op);
            epoll_fd_state_del(&fds, kn, del);                 /* We rely on the caller to mark the knote as disabled */
        }
    }
        break;
    }

    return (0);
}